

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

int __thiscall
kj::PathPtr::clone(PathPtr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  char *pcVar1;
  String *pSVar2;
  char *size;
  char *value;
  undefined8 *puVar3;
  ArrayBuilder<kj::String> builder;
  String *local_60;
  String local_48;
  
  pSVar2 = (String *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x18,0,*(size_t *)(__fn + 8),(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr *)0x0);
  local_60 = pSVar2;
  if (*(long *)(__fn + 8) != 0) {
    puVar3 = *(undefined8 **)__fn;
    do {
      pcVar1 = (char *)puVar3[1];
      value = pcVar1;
      if (pcVar1 != (char *)0x0) {
        value = (char *)*puVar3;
      }
      size = pcVar1 + -1;
      if (pcVar1 == (char *)0x0) {
        size = (char *)0x0;
      }
      heapString(&local_48,value,(size_t)size);
      (local_60->content).ptr = local_48.content.ptr;
      (local_60->content).size_ = local_48.content.size_;
      (local_60->content).disposer = local_48.content.disposer;
      local_60 = local_60 + 1;
      puVar3 = puVar3 + 3;
    } while (puVar3 != (undefined8 *)(*(long *)(__fn + 8) * 0x18 + *(long *)__fn));
  }
  (this->parts).ptr = pSVar2;
  (this->parts).size_ = ((long)local_60 - (long)pSVar2 >> 3) * -0x5555555555555555;
  this[1].parts.ptr = (String *)&kj::_::HeapArrayDisposer::instance;
  return (int)this;
}

Assistant:

Path PathPtr::clone() {
  return Path(KJ_MAP(p, parts) { return heapString(p); }, Path::ALREADY_CHECKED);
}